

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void comparison(Vm *vm)

{
  Compiler *pCVar1;
  Token *pTVar2;
  char *pcVar3;
  size_t sVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  TokenType TVar7;
  undefined4 uVar8;
  uint8_t instruction;
  Token local_50;
  
  arith_expr(vm);
  pCVar1 = &vm->compiler;
  pTVar2 = &(vm->compiler).next;
switchD_00105e9a_default:
  if (((((pCVar1->token).type != TOKEN_SMALLER) && ((pCVar1->token).type != TOKEN_SMALLER_EQUALS))
      && ((pCVar1->token).type != TOKEN_GREATER)) && ((pCVar1->token).type != TOKEN_GREATER_EQUALS))
  {
    return;
  }
  TVar7 = (pCVar1->token).type;
  uVar8 = *(undefined4 *)&(pCVar1->token).field_0x4;
  pcVar3 = (vm->compiler).token.start;
  uVar5 = (vm->compiler).token.line;
  uVar6 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
  (vm->compiler).previous.length = (vm->compiler).token.length;
  (vm->compiler).previous.line = uVar5;
  *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar6;
  (vm->compiler).previous.type = TVar7;
  *(undefined4 *)&(vm->compiler).previous.field_0x4 = uVar8;
  (vm->compiler).previous.start = pcVar3;
  uVar6 = *(undefined4 *)&pTVar2->field_0x4;
  pcVar3 = (vm->compiler).next.start;
  sVar4 = (vm->compiler).next.length;
  uVar5 = (vm->compiler).next.line;
  uVar8 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
  (pCVar1->token).type = pTVar2->type;
  *(undefined4 *)&(pCVar1->token).field_0x4 = uVar6;
  (vm->compiler).token.start = pcVar3;
  (vm->compiler).token.length = sVar4;
  (vm->compiler).token.line = uVar5;
  *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar8;
  scan_token(&local_50,&(vm->compiler).scanner);
  (vm->compiler).next.length = local_50.length;
  (vm->compiler).next.line = local_50.line;
  *(undefined4 *)&(vm->compiler).next.field_0x1c = local_50._28_4_;
  pTVar2->type = local_50.type;
  *(undefined4 *)&pTVar2->field_0x4 = local_50._4_4_;
  (vm->compiler).next.start = local_50.start;
  switch((vm->compiler).previous.type) {
  case TOKEN_SMALLER:
    instruction = '\x0f';
    break;
  case TOKEN_GREATER:
    instruction = '\x0e';
    break;
  case TOKEN_SMALLER_EQUALS:
    instruction = '\x11';
    break;
  case TOKEN_GREATER_EQUALS:
    instruction = '\x10';
    break;
  default:
    goto switchD_00105e9a_default;
  }
  arith_expr(vm);
  write_code_buffer(&(vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer,instruction);
  goto switchD_00105e9a_default;
}

Assistant:

static void comparison(Vm *vm) {
    arith_expr(vm);

    while (match(vm, TOKEN_SMALLER) || match(vm, TOKEN_SMALLER_EQUALS)
           || match(vm, TOKEN_GREATER) || match(vm, TOKEN_GREATER_EQUALS)) {
        switch (vm->compiler.previous.type) {
            case TOKEN_SMALLER:
                arith_expr(vm);
                emit_no_arg(vm, OP_LT);
                break;
            case TOKEN_SMALLER_EQUALS:
                arith_expr(vm);
                emit_no_arg(vm, OP_LE);
                break;
            case TOKEN_GREATER:
                arith_expr(vm);
                emit_no_arg(vm, OP_GT);
                break;
            case TOKEN_GREATER_EQUALS:
                arith_expr(vm);
                emit_no_arg(vm, OP_GE);
                break;
            default:
                break;
        }
    }
}